

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>
          *fadexpr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  ulong uVar5;
  value_type vVar6;
  value_type vVar7;
  
  uVar3 = FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
          ::size(&((fadexpr->fadexpr_).left_)->fadexpr_);
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar1 == uVar3) {
    if (uVar1 == 0) goto LAB_013fd3ad;
    pdVar4 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar3 != 0) {
        pdVar4 = (this->dx_).ptr_to_data;
        if (pdVar4 != (double *)0x0) {
          operator_delete__(pdVar4);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013fd3ad;
    }
    if (uVar3 != 0) {
      pdVar4 = (this->dx_).ptr_to_data;
      if (pdVar4 != (double *)0x0) {
        operator_delete__(pdVar4);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar5 = (ulong)uVar1 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar5);
    (this->dx_).ptr_to_data = pdVar4;
  }
  bVar2 = FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
          ::hasFastAccess(&((fadexpr->fadexpr_).left_)->fadexpr_);
  if ((bVar2) && ((((fadexpr->fadexpr_).right_)->dx_).num_elts != 0)) {
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        vVar6 = FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar5);
        pdVar4[uVar5] = vVar6;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  else if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      vVar6 = FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar5);
      pdVar4[uVar5] = vVar6;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
LAB_013fd3ad:
  vVar7 = FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>
          ::val(&((fadexpr->fadexpr_).left_)->fadexpr_);
  this->val_ = vVar7 / ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}